

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_SetWithDefaultsIC_Test::TestBody(TApp_SetWithDefaultsIC_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  AssertHelper local_1b0;
  Message local_1a8 [2];
  ArgumentMismatch *anon_var_0;
  char *pcStack_190;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158 [32];
  iterator local_138;
  size_type local_130;
  allocator local_121;
  string local_120;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_fd;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_fc;
  undefined1 local_fb;
  allocator local_fa;
  allocator local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0 [32];
  iterator local_b0;
  size_type local_a8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  allocator local_69;
  string local_68;
  allocator local_31;
  undefined1 local_30 [8];
  string someint;
  TApp_SetWithDefaultsIC_Test *this_local;
  
  someint.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"ho",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"-a",&local_69);
  local_fb = 1;
  local_f8 = &local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"Hi",&local_f9);
  local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"Ho",&local_fa);
  local_fb = 0;
  local_b0 = &local_f0;
  local_a8 = 2;
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_fd);
  __l_00._M_len = local_a8;
  __l_00._M_array = local_b0;
  CLI::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&local_a0,__l_00,&local_fc,&local_fd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"",&local_121);
  CLI::App::add_set_ignore_case
            (&(this->super_TApp).app,&local_68,(string *)local_30,&local_a0,&local_120,true);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  CLI::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&local_a0);
  CLI::std::
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_fd);
  local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0;
  do {
    local_208 = local_208 + -1;
    std::__cxx11::string::~string((string *)local_208);
  } while (local_208 != &local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fa);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  gtest_msg.value._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_178,"-aHi",(allocator *)((long)&gtest_msg.value + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"-aHo",(allocator *)((long)&gtest_msg.value + 6));
  gtest_msg.value._5_1_ = 0;
  local_138 = &local_178;
  local_130 = 2;
  __l._M_len = 2;
  __l._M_array = local_138;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_138;
  do {
    local_240 = local_240 + -1;
    std::__cxx11::string::~string((string *)local_240);
  } while (local_240 != &local_178);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffe70,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffe70);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0._7_1_ & 1) != 0) goto LAB_00150e0f;
    pcStack_190 = 
    "Expected: run() throws an exception of type CLI::ArgumentMismatch.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_1a8);
  testing::internal::AssertHelper::AssertHelper
            (&local_1b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x51d,pcStack_190);
  testing::internal::AssertHelper::operator=(&local_1b0,local_1a8);
  testing::internal::AssertHelper::~AssertHelper(&local_1b0);
  testing::Message::~Message(local_1a8);
LAB_00150e0f:
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(TApp, SetWithDefaultsIC) {
    std::string someint = "ho";
    app.add_set_ignore_case("-a", someint, {"Hi", "Ho"}, "", true);

    args = {"-aHi", "-aHo"};

    EXPECT_THROW(run(), CLI::ArgumentMismatch);
}